

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,int httpversion,dynbuf *req)

{
  curl_slist *pcVar1;
  char *pcVar2;
  bool bVar3;
  uchar uVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  void *pvVar8;
  long lVar9;
  undefined7 in_register_00000031;
  curl_slist **ppcVar10;
  Curl_str name;
  long local_68;
  char *p;
  curl_slist *h [2];
  Curl_str val;
  
  local_68 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    h[0] = (data->set).headers;
    if ((((ulong)data->conn->bits & 9) == 1) && (((data->set).field_0x89c & 0x40) != 0)) {
      h[1] = (data->set).proxyheaders;
      local_68 = 2;
    }
  }
  else {
    if (((data->set).field_0x89c & 0x40) == 0) {
      h[0] = (data->set).headers;
    }
    else {
      h[0] = (data->set).proxyheaders;
    }
  }
  lVar9 = 0;
  do {
    if (lVar9 == local_68) {
      return CURLE_OK;
    }
    ppcVar10 = h + lVar9;
    while( true ) {
      pcVar1 = *ppcVar10;
      if (pcVar1 == (curl_slist *)0x0) break;
      pcVar2 = pcVar1->data;
      p = pcVar2;
      iVar6 = Curl_str_until(&p,&name,0x4b000,';');
      if ((((iVar6 == 0) && (iVar6 = Curl_str_single(&p,';'), iVar6 == 0)) &&
          (iVar6 = Curl_str_single(&p,'\0'), iVar6 == 0)) &&
         (pvVar8 = memchr(name.str,0x3a,CONCAT44(name.len._4_4_,(uint)name.len)),
         pvVar8 == (void *)0x0)) {
        bVar3 = true;
LAB_00134b7c:
        if (((data->state).aptr.host == (char *)0x0) ||
           (iVar6 = Curl_str_casecompare(&name,"Host"), iVar6 == 0)) {
          uVar4 = (data->state).httpreq;
          if (uVar4 == '\x02') {
            iVar6 = Curl_str_casecompare(&name,"Content-Type");
            if (iVar6 != 0) goto LAB_00134b31;
            uVar4 = (data->state).httpreq;
          }
          if (((((uVar4 != '\x03') ||
                (iVar6 = Curl_str_casecompare(&name,"Content-Type"), iVar6 == 0)) &&
               ((((data->req).field_0xd3 & 4) == 0 ||
                (iVar6 = Curl_str_casecompare(&name,"Content-Length"), iVar6 == 0)))) &&
              ((((data->state).aptr.te == (char *)0x0 ||
                (iVar6 = Curl_str_casecompare(&name,"Connection"), iVar6 == 0)) &&
               ((httpversion < 0x14 ||
                (iVar6 = Curl_str_casecompare(&name,"Transfer-Encoding"), iVar6 == 0)))))) &&
             (((iVar6 = Curl_str_casecompare(&name,"Authorization"), iVar6 == 0 &&
               (iVar6 = Curl_str_casecompare(&name,"Cookie"), iVar6 == 0)) ||
              (_Var5 = Curl_auth_allowed_to_host(data), _Var5)))) {
            if (bVar3) {
              CVar7 = Curl_dyn_addf(req,"%.*s:\r\n",(ulong)(uint)name.len,name.str);
            }
            else {
              CVar7 = Curl_dyn_addf(req,"%s\r\n",pcVar2);
            }
            if (CVar7 != CURLE_OK) {
              return CVar7;
            }
          }
        }
      }
      else {
        p = pcVar2;
        iVar6 = Curl_str_until(&p,&name,0x4b000,':');
        if ((iVar6 == 0) && (iVar6 = Curl_str_single(&p,':'), iVar6 == 0)) {
          Curl_str_untilnl(&p,&val,0x4b000);
          Curl_str_trimblanks(&val);
          if (val.len != 0) {
            bVar3 = false;
            goto LAB_00134b7c;
          }
        }
      }
LAB_00134b31:
      ppcVar10 = &pcVar1->next;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect, int httpversion,
                                 struct dynbuf *req)
{
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum Curl_proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = data->conn->bits.httpproxy && !data->conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      CURLcode result = CURLE_OK;
      bool blankheader = FALSE;
      struct Curl_str name;
      const char *p = headers->data;
      const char *origp = p;

      /* explicitly asked to send header without content is done by a header
         that ends with a semicolon, but there must be no colon present in the
         name */
      if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ';') &&
         !Curl_str_single(&p, ';') &&
         !Curl_str_single(&p, '\0') &&
         !memchr(Curl_str(&name), ':', Curl_strlen(&name)))
        blankheader = TRUE;
      else {
        p = origp;
        if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ':') &&
           !Curl_str_single(&p, ':')) {
          struct Curl_str val;
          Curl_str_untilnl(&p, &val, MAX_HTTP_RESP_HEADER_SIZE);
          Curl_str_trimblanks(&val);
          if(!Curl_strlen(&val))
            /* no content, don't send this */
            continue;
        }
        else
          /* no colon */
          continue;
      }

      /* only send this if the contents was non-blank or done special */

      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom
            Host: header as that will produce *two* in the same
            request! */
         Curl_str_casecompare(&name, "Host"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              Curl_str_casecompare(&name, "Content-Length"))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              Curl_str_casecompare(&name, "Connection"))
        ;
      else if((httpversion >= 20) &&
              Curl_str_casecompare(&name, "Transfer-Encoding"))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((Curl_str_casecompare(&name, "Authorization") ||
               Curl_str_casecompare(&name, "Cookie")) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else if(blankheader)
        result = Curl_dyn_addf(req, "%.*s:\r\n", (int)Curl_strlen(&name),
                               Curl_str(&name));
      else
        result = Curl_dyn_addf(req, "%s\r\n", origp);

      if(result)
        return result;
    }
  }

  return CURLE_OK;
}